

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O3

MPP_RET avsd_set_dpb(AvsdCtx_t *p_dec,HalDecTask *task)

{
  RK_U8 RVar1;
  RK_U32 RVar2;
  int iVar3;
  int index;
  AvsdFrame_t *pAVar4;
  RK_S64 RVar5;
  MPP_RET MVar6;
  RK_U32 RVar7;
  RK_S32 RVar8;
  MppFrame mframe;
  RK_S32 slot_idx;
  MppFrame local_38;
  RK_S32 local_2c;
  
  local_38 = (MppFrame)0x0;
  local_2c = -1;
  pAVar4 = p_dec->cur;
  mpp_buf_slot_get_unused(p_dec->frame_slots,&local_2c);
  if (local_2c < 0) {
    MVar6 = MPP_NOK;
    if (((byte)avsd_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avsd_parse","error, buf_slot has not get.\n",(char *)0x0);
    }
  }
  else {
    pAVar4->slot_idx = local_2c;
    pAVar4->pic_type = (uint)(p_dec->ph).picture_coding_type;
    RVar7 = (p_dec->vsh).horizontal_size;
    pAVar4->width = RVar7;
    RVar2 = (p_dec->vsh).vertical_size;
    pAVar4->height = RVar2;
    pAVar4->hor_stride = RVar7 + 0xf & 0xfffffff0;
    pAVar4->ver_stride = RVar2 + 0xf & 0xfffffff0;
    RVar5 = mpp_packet_get_pts(task->input_packet);
    pAVar4->pts = RVar5;
    RVar5 = mpp_packet_get_dts(task->input_packet);
    pAVar4->dts = RVar5;
    mpp_frame_init(&local_38);
    mpp_frame_set_fmt(local_38,MPP_FMT_YUV420SP);
    mpp_frame_set_hor_stride(local_38,pAVar4->hor_stride);
    mpp_frame_set_ver_stride(local_38,pAVar4->ver_stride);
    mpp_frame_set_width(local_38,pAVar4->width);
    mpp_frame_set_height(local_38,pAVar4->height);
    mpp_frame_set_pts(local_38,pAVar4->pts);
    mpp_frame_set_dts(local_38,pAVar4->dts);
    if ((p_dec->ph).picture_structure == '\0') {
      RVar7 = (int)((((p_dec->init).cfg)->base).enable_vproc << 0x1e) >> 0x1f & 0xc;
    }
    else {
      RVar7 = (uint)((p_dec->ph).top_field_first == '\0') * 4 + 7;
    }
    pAVar4->frame_mode = RVar7;
    mpp_frame_set_mode(local_38,RVar7);
    mpp_buf_slot_set_prop(p_dec->frame_slots,local_2c,SLOT_FRAME,local_38);
    mpp_frame_deinit(&local_38);
    mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar4->slot_idx,SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar4->slot_idx,SLOT_HAL_OUTPUT);
    iVar3 = p_dec->cur->slot_idx;
    task->output = iVar3;
    if ((p_dec->dpb[0] != (AvsdFrame_t *)0x0) &&
       (index = p_dec->dpb[0]->slot_idx, index != iVar3 && -1 < index)) {
      mpp_buf_slot_set_flag(p_dec->frame_slots,index,SLOT_HAL_INPUT);
      RVar8 = p_dec->dpb[0]->slot_idx;
      if ((p_dec->ph).picture_coding_type == '\x02') {
        task->refer[1] = RVar8;
      }
      else {
        task->refer[0] = RVar8;
      }
    }
    if (((p_dec->dpb[1] != (AvsdFrame_t *)0x0) && (iVar3 = p_dec->dpb[1]->slot_idx, -1 < iVar3)) &&
       (iVar3 != p_dec->cur->slot_idx)) {
      mpp_buf_slot_set_flag(p_dec->frame_slots,iVar3,SLOT_HAL_INPUT);
      RVar8 = p_dec->dpb[1]->slot_idx;
      if ((p_dec->ph).picture_coding_type == '\x02') {
        task->refer[0] = RVar8;
      }
      else {
        task->refer[1] = RVar8;
      }
    }
    RVar1 = (p_dec->ph).picture_coding_type;
    MVar6 = MPP_OK;
    if (RVar1 == '\x02') {
      *(byte *)&task->flags = *(byte *)&task->flags & 0xef;
      if ((-1 < task->refer[0]) &&
         (mpp_buf_slot_get_prop(p_dec->frame_slots,task->refer[0],SLOT_FRAME_PTR,&local_38),
         local_38 != (MppFrame)0x0)) {
        RVar7 = mpp_frame_get_errinfo(local_38);
        (task->flags).val =
             (task->flags).val & 0xfffffffffffffff7 |
             (ulong)((RVar7 << 3 | (uint)(task->flags).val) & 8);
      }
      RVar8 = task->refer[1];
    }
    else {
      if (RVar1 != '\x01') {
        if (RVar1 != '\0') {
          return MPP_OK;
        }
        (task->flags).val = (task->flags).val & 0xffffffffffffffe7 | 0x10;
        return MPP_OK;
      }
      *(byte *)&task->flags = *(byte *)&task->flags | 0x10;
      RVar8 = task->refer[0];
    }
    if ((-1 < RVar8) &&
       (mpp_buf_slot_get_prop(p_dec->frame_slots,RVar8,SLOT_FRAME_PTR,&local_38),
       local_38 != (MppFrame)0x0)) {
      RVar7 = mpp_frame_get_errinfo(local_38);
      (task->flags).val =
           (task->flags).val & 0xfffffffffffffff7 |
           (ulong)((RVar7 << 3 | (uint)(task->flags).val) & 8);
    }
  }
  return MVar6;
}

Assistant:

MPP_RET avsd_set_dpb(AvsdCtx_t *p_dec, HalDecTask *task)
{
    MppFrame mframe = NULL;
    RK_S32 slot_idx = -1;
    AvsdFrame_t *p_cur = p_dec->cur;

    //!< set current dpb for decode
    mpp_buf_slot_get_unused(p_dec->frame_slots, &slot_idx);
    if (slot_idx < 0) {
        AVSD_DBG(AVSD_DBG_WARNNING, "error, buf_slot has not get.\n");
        goto __FAILED;
    }
    //!< init current frame data
    p_cur->slot_idx = slot_idx;
    p_cur->pic_type = p_dec->ph.picture_coding_type;
    p_cur->width = p_dec->vsh.horizontal_size;
    p_cur->height = p_dec->vsh.vertical_size;
    p_cur->hor_stride = MPP_ALIGN(p_dec->vsh.horizontal_size, 16);
    p_cur->ver_stride = MPP_ALIGN(p_dec->vsh.vertical_size, 16);
    p_cur->pts = mpp_packet_get_pts(task->input_packet);
    p_cur->dts = mpp_packet_get_dts(task->input_packet);
    //!< set frame info
    mpp_frame_init(&mframe);
    mpp_frame_set_fmt(mframe, MPP_FMT_YUV420SP);
    mpp_frame_set_hor_stride(mframe, p_cur->hor_stride);  // before crop
    mpp_frame_set_ver_stride(mframe, p_cur->ver_stride);
    mpp_frame_set_width(mframe, p_cur->width);  // after crop
    mpp_frame_set_height(mframe, p_cur->height);
    mpp_frame_set_pts(mframe, p_cur->pts);
    mpp_frame_set_dts(mframe, p_cur->dts);
    if (p_dec->ph.picture_structure) { //!< data combine 2 field
        p_cur->frame_mode = MPP_FRAME_FLAG_PAIRED_FIELD;
        if (p_dec->ph.top_field_first) {
            p_cur->frame_mode |= MPP_FRAME_FLAG_TOP_FIRST;
        } else {
            p_cur->frame_mode |= MPP_FRAME_FLAG_BOT_FIRST;
        }
    } else { //!< frame picture
        p_cur->frame_mode = MPP_FRAME_FLAG_FRAME;

        if (p_dec->init.cfg->base.enable_vproc & MPP_VPROC_MODE_DETECTION) {
            p_cur->frame_mode |= MPP_FRAME_FLAG_DEINTERLACED;
        }
    }
    mpp_frame_set_mode(mframe, p_cur->frame_mode);
    mpp_buf_slot_set_prop(p_dec->frame_slots, slot_idx, SLOT_FRAME, mframe);
    mpp_frame_deinit(&mframe);

    mpp_buf_slot_set_flag(p_dec->frame_slots, p_cur->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p_cur->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task
    task->output = p_dec->cur->slot_idx;
    //!< set task refers
    if (p_dec->dpb[0] && p_dec->dpb[0]->slot_idx >= 0 &&
        (p_dec->dpb[0]->slot_idx != p_dec->cur->slot_idx)) {
        mpp_buf_slot_set_flag(p_dec->frame_slots, p_dec->dpb[0]->slot_idx, SLOT_HAL_INPUT);
        if (p_dec->ph.picture_coding_type == B_PICTURE) {
            task->refer[1] = p_dec->dpb[0]->slot_idx;
        } else {
            task->refer[0] = p_dec->dpb[0]->slot_idx;
        }
    }
    if (p_dec->dpb[1] && p_dec->dpb[1]->slot_idx >= 0 &&
        (p_dec->dpb[1]->slot_idx != p_dec->cur->slot_idx)) {
        mpp_buf_slot_set_flag(p_dec->frame_slots, p_dec->dpb[1]->slot_idx, SLOT_HAL_INPUT);
        if (p_dec->ph.picture_coding_type == B_PICTURE) {
            task->refer[0] = p_dec->dpb[1]->slot_idx;
        } else {
            task->refer[1] = p_dec->dpb[1]->slot_idx;
        }
    }

    //!< set ref flag and mark error
    if (p_dec->ph.picture_coding_type == I_PICTURE) {
        task->flags.used_for_ref = 1;
        task->flags.ref_err = 0;
    } else if (p_dec->ph.picture_coding_type == P_PICTURE) {
        task->flags.used_for_ref = 1;
        if (task->refer[0] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[0], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
    } else if (p_dec->ph.picture_coding_type == B_PICTURE) {
        task->flags.used_for_ref = 0;
        if (task->refer[0] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[0], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
        if (task->refer[1] >= 0) {
            mpp_buf_slot_get_prop(p_dec->frame_slots, task->refer[1], SLOT_FRAME_PTR, &mframe);
            if (mframe)
                task->flags.ref_err |= mpp_frame_get_errinfo(mframe);
        }
    }

    return MPP_OK;
__FAILED:
    return MPP_NOK;
}